

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  unsigned_long uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar15 = r->_begin;
  uVar16 = r->_end;
  if (uVar15 < uVar16) {
    auVar17._8_4_ = 0xff800000;
    auVar17._0_8_ = 0xff800000ff800000;
    auVar17._12_4_ = 0xff800000;
    auVar18 = ZEXT1664(auVar17);
    auVar19._8_4_ = 0x7f800000;
    auVar19._0_8_ = 0x7f8000007f800000;
    auVar19._12_4_ = 0x7f800000;
    auVar20 = ZEXT1664(auVar19);
    sVar12 = 0;
    auVar27._8_4_ = 0xddccb9a2;
    auVar27._0_8_ = 0xddccb9a2ddccb9a2;
    auVar27._12_4_ = 0xddccb9a2;
    auVar28._8_4_ = 0x5dccb9a2;
    auVar28._0_8_ = 0x5dccb9a25dccb9a2;
    auVar28._12_4_ = 0x5dccb9a2;
    auVar23 = ZEXT1664(auVar19);
    auVar26 = ZEXT1664(auVar17);
    do {
      pBVar2 = (this->super_LineSegments).vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar15);
      uVar10 = (ulong)(uVar1 + 1);
      sVar13 = k;
      if (uVar10 < (pBVar2->super_RawBufferView).num) {
        pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
        sVar4 = (pBVar2->super_RawBufferView).stride;
        auVar17 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar1);
        uVar8 = vcmpps_avx512vl(auVar17,auVar27,6);
        uVar9 = vcmpps_avx512vl(auVar17,auVar28,1);
        if ((byte)((byte)uVar8 & (byte)uVar9) == 0xf) {
          auVar19 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar10);
          uVar8 = vcmpps_avx512vl(auVar19,auVar27,6);
          uVar9 = vcmpps_avx512vl(auVar19,auVar28,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) == 0xf) {
            auVar17 = vshufps_avx(auVar17,auVar17,0xff);
            auVar19 = vshufps_avx(auVar19,auVar19,0xff);
            auVar17 = vminss_avx(auVar17,auVar19);
            if (0.0 <= auVar17._0_4_) {
              pcVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
              sVar13 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
              lVar14 = uVar1 * sVar13;
              lVar11 = uVar10 * sVar13;
              auVar29 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar14),
                                   *(undefined1 (*) [16])(pcVar3 + lVar11));
              auVar17 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar14),
                                   *(undefined1 (*) [16])(pcVar3 + lVar11));
              auVar19 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar11 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar3 + lVar14 + 0xc)));
              fVar7 = auVar19._0_4_ * (this->super_LineSegments).maxRadiusScale;
              auVar30._4_4_ = fVar7;
              auVar30._0_4_ = fVar7;
              auVar30._8_4_ = fVar7;
              auVar30._12_4_ = fVar7;
              auVar19 = vsubps_avx(auVar29,auVar30);
              aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar19,ZEXT416(geomID),0x30);
              auVar29._0_4_ = auVar17._0_4_ + fVar7;
              auVar29._4_4_ = auVar17._4_4_ + fVar7;
              auVar29._8_4_ = auVar17._8_4_ + fVar7;
              auVar29._12_4_ = auVar17._12_4_ + fVar7;
              aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar29,ZEXT416((uint)uVar15),0x30);
              auVar17 = vminps_avx(auVar20._0_16_,(undefined1  [16])aVar5);
              auVar20 = ZEXT1664(auVar17);
              auVar17 = vmaxps_avx(auVar18._0_16_,(undefined1  [16])aVar6);
              auVar18 = ZEXT1664(auVar17);
              auVar31._0_4_ = aVar5.x + aVar6.x;
              auVar31._4_4_ = aVar5.y + aVar6.y;
              auVar31._8_4_ = aVar5.z + aVar6.z;
              auVar31._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
              auVar17 = vminps_avx(auVar23._0_16_,auVar31);
              auVar23 = ZEXT1664(auVar17);
              auVar17 = vmaxps_avx(auVar26._0_16_,auVar31);
              auVar26 = ZEXT1664(auVar17);
              sVar12 = sVar12 + 1;
              sVar13 = k + 1;
              prims[k].upper.field_0.field_1 = aVar6;
              prims[k].lower.field_0.field_1 = aVar5;
              uVar16 = r->_end;
            }
          }
        }
      }
      aVar24 = auVar26._0_16_;
      aVar21 = auVar23._0_16_;
      aVar25 = auVar18._0_16_;
      aVar22 = auVar20._0_16_;
      uVar15 = uVar15 + 1;
      k = sVar13;
    } while (uVar15 < uVar16);
  }
  else {
    aVar22.m128[2] = INFINITY;
    aVar22._0_8_ = 0x7f8000007f800000;
    aVar22.m128[3] = INFINITY;
    aVar25.m128[2] = -INFINITY;
    aVar25._0_8_ = 0xff800000ff800000;
    aVar25.m128[3] = -INFINITY;
    sVar12 = 0;
    aVar21 = aVar22;
    aVar24 = aVar25;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar24;
  __return_storage_ptr__->end = sVar12;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }